

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

Vector2f __thiscall sf::Text::findCharacterPos(Text *this,size_t index)

{
  float fVar1;
  Uint32 second;
  size_t sVar2;
  Glyph *pGVar3;
  Transform *this_00;
  bool bold;
  String *this_01;
  Uint32 first;
  float fVar4;
  float fVar5;
  Vector2f VVar6;
  float fVar7;
  float fVar8;
  float local_58;
  float local_54;
  Vector2f local_38;
  
  if (this->m_font == (Font *)0x0) {
    VVar6.x = 0.0;
    VVar6.y = 0.0;
  }
  else {
    this_01 = &this->m_string;
    sVar2 = String::getSize(this_01);
    if (sVar2 < index) {
      index = String::getSize(this_01);
    }
    bold = (bool)((byte)this->m_style & 1);
    local_54 = 0.0;
    pGVar3 = Font::getGlyph(this->m_font,0x20,this->m_characterSize,bold,0.0);
    fVar7 = pGVar3->advance;
    fVar1 = this->m_letterSpacingFactor;
    fVar4 = Font::getLineSpacing(this->m_font,this->m_characterSize);
    local_58 = 0.0;
    if (index != 0) {
      fVar8 = (fVar1 + -1.0) * (fVar7 / 3.0);
      fVar7 = fVar7 + fVar8;
      fVar1 = this->m_lineSpacingFactor;
      local_58 = 0.0;
      sVar2 = 0;
      local_54 = 0.0;
      first = 0;
      do {
        second = String::operator[](this_01,sVar2);
        fVar5 = Font::getKerning(this->m_font,first,second,this->m_characterSize,bold);
        fVar5 = fVar5 + local_58;
        if (second == 9) {
          local_58 = fVar5 + fVar7 * 4.0;
        }
        else if (second == 10) {
          local_54 = local_54 + fVar4 * fVar1;
          local_58 = 0.0;
        }
        else if (second == 0x20) {
          local_58 = fVar5 + fVar7;
        }
        else {
          pGVar3 = Font::getGlyph(this->m_font,second,this->m_characterSize,bold,0.0);
          local_58 = fVar5 + pGVar3->advance + fVar8;
        }
        sVar2 = sVar2 + 1;
        first = second;
      } while (index != sVar2);
    }
    local_38.y = local_54;
    local_38.x = local_58;
    this_00 = Transformable::getTransform(&this->super_Transformable);
    VVar6 = Transform::transformPoint(this_00,&local_38);
  }
  return VVar6;
}

Assistant:

Vector2f Text::findCharacterPos(std::size_t index) const
{
    // Make sure that we have a valid font
    if (!m_font)
        return Vector2f();

    // Adjust the index if it's out of range
    if (index > m_string.getSize())
        index = m_string.getSize();

    // Precompute the variables needed by the algorithm
    bool  isBold          = m_style & Bold;
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;

    // Compute the position
    Vector2f position;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < index; ++i)
    {
        Uint32 curChar = m_string[i];

        // Apply the kerning offset
        position.x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);
        prevChar = curChar;

        // Handle special characters
        switch (curChar)
        {
            case ' ':  position.x += whitespaceWidth;             continue;
            case '\t': position.x += whitespaceWidth * 4;         continue;
            case '\n': position.y += lineSpacing; position.x = 0; continue;
        }

        // For regular characters, add the advance offset of the glyph
        position.x += m_font->getGlyph(curChar, m_characterSize, isBold).advance + letterSpacing;
    }

    // Transform the position to global coordinates
    position = getTransform().transformPoint(position);

    return position;
}